

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O3

void __thiscall Vault::TlsStrategy::~TlsStrategy(TlsStrategy *this)

{
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__TlsStrategy_001c2648;
  if (*(undefined1 **)&this->key_ != &this->field_0x38) {
    operator_delete(*(undefined1 **)&this->key_,*(long *)&this->field_0x38 + 1);
  }
  if (*(undefined1 **)&this->cert_ != &this->field_0x18) {
    operator_delete(*(undefined1 **)&this->cert_,*(long *)&this->field_0x18 + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

explicit TlsStrategy(Certificate cert, Certificate key)
      : cert_(std::move(cert)), key_(std::move(key)) {}